

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void * stb__alloc_chunk(stb__alloc *src,int size,int align,int pre_align)

{
  void *pvVar1;
  stb__chunk *psVar2;
  int local_44;
  int chunk_size;
  stb__chunk *n;
  stb__chunk *c;
  void *p;
  int pre_align_local;
  int align_local;
  int size_local;
  stb__alloc *src_local;
  
  psVar2 = src->chunks;
  n = (stb__chunk *)((long)&psVar2[-1].alloc + 2);
  if ((n != (stb__chunk *)0x0) && (size <= stb_alloc_chunk_size)) {
    pvVar1 = stb__try_chunk(n,size,align,pre_align);
    if (pvVar1 != (void *)0x0) {
      *(int *)((long)&psVar2->data_left + 2) = *(int *)((long)&psVar2->data_left + 2) + 1;
      return pvVar1;
    }
    if (n->next != (stb__chunk *)0x0) {
      pvVar1 = stb__try_chunk(n->next,size,align,pre_align);
      if (pvVar1 != (void *)0x0) {
        *(int *)((long)&psVar2->data_left + 2) = *(int *)((long)&psVar2->data_left + 2) + 1;
        return pvVar1;
      }
      stb__sort_chunks(src);
      n = (stb__chunk *)((long)&src->chunks[-1].alloc + 2);
    }
  }
  local_44 = stb_alloc_chunk_size;
  if (stb_alloc_chunk_size < size) {
    local_44 = size;
  }
  if (0x10 < (long)pre_align + 0x10U) {
    __assert_fail("sizeof(*n) + pre_align <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0xaa0,"void *stb__alloc_chunk(stb__alloc *, int, int, int)");
  }
  while( true ) {
    psVar2 = (stb__chunk *)malloc((long)(local_44 + 0x10));
    if (psVar2 == (stb__chunk *)0x0) {
      return (void *)0x0;
    }
    psVar2->data_left = local_44 + -0x10;
    pvVar1 = stb__try_chunk(psVar2,size,align,pre_align);
    if (pvVar1 != (void *)0x0) break;
    free(psVar2);
    local_44 = align + 0x10 + local_44;
  }
  psVar2->next = n;
  src->chunks = (stb__chunk *)((long)&psVar2->next + 2);
  psVar2->alloc = 1;
  if (size != local_44) {
    return pvVar1;
  }
  stb__sort_chunks(src);
  return pvVar1;
}

Assistant:

static void * stb__alloc_chunk(stb__alloc *src, int size, int align, int pre_align)
{
   void *p;
   stb__chunk *c = stb__chunks(src);

   if (c && size <= stb_alloc_chunk_size) {

      p = stb__try_chunk(c, size, align, pre_align);
      if (p) { ++c->alloc; return p; }

      // try a second chunk to reduce wastage
      if (c->next) {
         p = stb__try_chunk(c->next, size, align, pre_align);
         if (p) { ++c->alloc; return p; }
   
         // put the bigger chunk first, since the second will get buried
         // the upshot of this is that, until it gets allocated from, chunk #2
         // is always the largest remaining chunk. (could formalize
         // this with a heap!)
         stb__sort_chunks(src);
         c = stb__chunks(src);
      }
   }

   // allocate a new chunk
   {
      stb__chunk *n;

      int chunk_size = stb_alloc_chunk_size;
      // we're going to allocate a new chunk to put this in
      if (size > chunk_size)
         chunk_size = size;

      assert(sizeof(*n) + pre_align <= 16);

      // loop trying to allocate a large enough chunk
      // the loop is because the alignment may cause problems if it's big...
      // and we don't know what our chunk alignment is going to be
      while (1) {
         n = (stb__chunk *) malloc(16 + chunk_size);
         if (n == NULL) return NULL;

         n->data_left = chunk_size - sizeof(*n);

         p = stb__try_chunk(n, size, align, pre_align);
         if (p != NULL) {
            n->next = c;
            stb__setchunks(src, n);

            // if we just used up the whole block immediately,
            // move the following chunk up
            n->alloc = 1;
            if (size == chunk_size)
               stb__sort_chunks(src);

            return p;
         }

         free(n);
         chunk_size += 16+align;
      }
   }
}